

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

VP8StatusCode WebPParseHeaders(WebPHeaderStructure *headers)

{
  VP8StatusCode VVar1;
  int has_animation;
  VP8StatusCode status;
  int *in_stack_00000050;
  int *in_stack_00000058;
  int *in_stack_00000060;
  int *in_stack_00000068;
  size_t in_stack_00000070;
  uint8_t *in_stack_00000078;
  int *in_stack_00000090;
  WebPHeaderStructure *in_stack_00000098;
  
  VVar1 = ParseHeadersInternal
                    (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                     in_stack_00000058,in_stack_00000050,in_stack_00000090,in_stack_00000098);
  return VVar1;
}

Assistant:

VP8StatusCode WebPParseHeaders(WebPHeaderStructure* const headers) {
  // status is marked volatile as a workaround for a clang-3.8 (aarch64) bug
  volatile VP8StatusCode status;
  int has_animation = 0;
  assert(headers != NULL);
  // fill out headers, ignore width/height/has_alpha.
  status = ParseHeadersInternal(headers->data, headers->data_size,
                                NULL, NULL, NULL, &has_animation,
                                NULL, headers);
  if (status == VP8_STATUS_OK || status == VP8_STATUS_NOT_ENOUGH_DATA) {
    // The WebPDemux API + libwebp can be used to decode individual
    // uncomposited frames or the WebPAnimDecoder can be used to fully
    // reconstruct them (see webp/demux.h).
    if (has_animation) {
      status = VP8_STATUS_UNSUPPORTED_FEATURE;
    }
  }
  return status;
}